

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

void absl::lts_20250127::base_internal::LLA_SkiplistDelete
               (AllocList *head,AllocList *e,AllocList **prev)

{
  int iVar1;
  uint uVar2;
  uintptr_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  AllocList *pAVar6;
  code *extraout_RDX;
  ulong uVar7;
  AllocList *pAVar8;
  bool bVar9;
  
  iVar1 = head->levels;
  uVar5 = (ulong)iVar1;
  uVar7 = uVar5;
  pAVar6 = head;
  if (0 < (long)uVar5) {
    do {
      do {
        pAVar8 = pAVar6;
        pAVar6 = pAVar8->next[uVar7 - 1];
        if (pAVar6 == (AllocList *)0x0) break;
      } while (pAVar6 < e);
      prev[uVar7 - 1] = pAVar8;
      bVar9 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
      pAVar6 = pAVar8;
    } while (bVar9);
  }
  if (iVar1 == 0) {
    pAVar6 = (AllocList *)0x0;
  }
  else {
    pAVar6 = (*prev)->next[0];
  }
  if (pAVar6 == e) {
    uVar2 = e->levels;
    if ((ulong)uVar2 != 0) {
      uVar7 = 0;
      do {
        if (prev[uVar7]->next[uVar7] != e) break;
        prev[uVar7]->next[uVar7] = e->next[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    if (0 < iVar1) {
      do {
        if (head->next[uVar5 - 1] != (AllocList *)0x0) {
          return;
        }
        head->levels = (int)uVar5 + -1;
        bVar9 = 1 < uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar9);
    }
    return;
  }
  LLA_SkiplistDelete();
  iVar1 = (int)(head->header).size;
  if (iVar1 < 0x5a308d2) {
    if ((iVar1 != 0) && (iVar1 != 0xdd)) {
LAB_003867ad:
      raw_log_internal::RawLog(kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx")
      ;
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/base/call_once.h"
                    ,0xa4,
                    "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = void (&)(), Args = <>]"
                   );
    }
  }
  else if ((iVar1 != 0x5a308d2) && (iVar1 != 0x65c2937b)) goto LAB_003867ad;
  LOCK();
  bVar9 = (int)(head->header).size == 0;
  if (bVar9) {
    *(undefined4 *)&(head->header).size = 0x65c2937b;
  }
  UNLOCK();
  if ((bVar9) ||
     (uVar4 = SpinLockWait((atomic<unsigned_int> *)head,3,CallOnceImpl<void_(&)()>::trans,
                           (SchedulingMode)e), uVar4 == 0)) {
    (*extraout_RDX)();
    LOCK();
    uVar3 = (head->header).size;
    *(undefined4 *)&(head->header).size = 0xdd;
    UNLOCK();
    if ((int)uVar3 == 0x5a308d2) {
      AbslInternalSpinLockWake_lts_20250127((atomic<unsigned_int> *)head,true);
      return;
    }
  }
  return;
}

Assistant:

static void LLA_SkiplistDelete(AllocList *head, AllocList *e,
                               AllocList **prev) {
  AllocList *found = LLA_SkiplistSearch(head, e, prev);
  ABSL_RAW_CHECK(e == found, "element not in freelist");
  for (int i = 0; i != e->levels && prev[i]->next[i] == e; i++) {
    prev[i]->next[i] = e->next[i];
  }
  while (head->levels > 0 && head->next[head->levels - 1] == nullptr) {
    head->levels--;  // reduce head->levels if level unused
  }
}